

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O1

void cfl_subsample_hbd_444_32x16_avx2(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  ulong uVar1;
  __m256i *row;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  pauVar2 = (undefined1 (*) [32])(cfl_type + 0x10);
  uVar1 = 0xffffffffffffffc0;
  do {
    auVar4 = *pauVar2;
    auVar3 = vpsllw_avx2(pauVar2[-1],3);
    *(undefined1 (*) [32])((long)output_q3 + uVar1 + 0x40) = auVar3;
    auVar4 = vpsllw_avx2(auVar4,3);
    *(undefined1 (*) [32])((long)output_q3 + uVar1 + 0x60) = auVar4;
    uVar1 = uVar1 + 0x40;
    pauVar2 = (undefined1 (*) [32])(*pauVar2 + (long)input_stride * 2);
  } while (uVar1 < 0x3c0);
  return;
}

Assistant:

static inline __m256i predict_unclipped(const __m256i *input, __m256i alpha_q12,
                                        __m256i alpha_sign, __m256i dc_q0) {
  __m256i ac_q3 = _mm256_loadu_si256(input);
  __m256i ac_sign = _mm256_sign_epi16(alpha_sign, ac_q3);
  __m256i scaled_luma_q0 =
      _mm256_mulhrs_epi16(_mm256_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm256_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm256_add_epi16(scaled_luma_q0, dc_q0);
}